

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O1

error_code __thiscall
pstore::exchange::import_ns::address_patch::operator()
          (address_patch *this,transaction_base *transaction)

{
  uint uVar1;
  uint uVar2;
  uint64_t uVar3;
  _Type acVar4;
  database *db;
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *phVar5;
  bool bVar6;
  linked_definitions *plVar7;
  value_reference_type ppVar8;
  error_category *peVar9;
  long lVar10;
  error_code eVar11;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  compilations;
  shared_ptr<pstore::repo::fragment> fragment;
  shared_ptr<const_pstore::repo::compilation> compilation;
  const_iterator pos;
  uint local_254;
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *local_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_240;
  error_category *local_238;
  value_type *local_230;
  transaction_base *local_228;
  undefined1 local_220 [16];
  undefined1 local_210 [224];
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *local_130;
  void *local_128;
  const_iterator local_120;
  
  index::
  get_index<(pstore::trailer::indices)0,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
            ((index *)&local_248,(this->db_).ptr_,true);
  local_228 = transaction;
  repo::fragment::
  load_impl<std::shared_ptr<pstore::repo::fragment>,pstore::repo::fragment::load(pstore::transaction_base&,pstore::extent<pstore::repo::fragment>const&)::_lambda(pstore::extent<pstore::repo::fragment>const&)_1_>
            ((fragment *)local_220,&this->fragment_extent_,(anon_class_8_1_9131bd3e)transaction);
  plVar7 = repo::fragment::
           at_impl<(pstore::repo::section_kind)18,pstore::repo::fragment&,pstore::repo::linked_definitions>
                     ((fragment *)local_220._0_8_);
  uVar3 = plVar7->size_;
  if (uVar3 != 0) {
    local_230 = plVar7->definitions_;
    lVar10 = 0;
    do {
      index::
      hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
      ::find<pstore::uint128,void>
                (&local_120,
                 (hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
                  *)local_248,(this->db_).ptr_,
                 (uint128 *)((long)&(local_230->compilation).v_ + lVar10));
      phVar5 = local_248;
      acVar4 = (_Type)(this->db_).ptr_;
      bVar6 = false;
      memset(local_210 + 8,0,0xd8);
      local_130 = phVar5;
      local_128 = (void *)0x0;
      local_210._0_8_ = acVar4;
      if (local_120.index_ == phVar5) {
        bVar6 = array_stack<pstore::index::details::parent_type,_13UL>::operator==
                          (&local_120.visited_parents_,
                           (array_stack<pstore::index::details::parent_type,_13UL> *)(local_210 + 8)
                          );
      }
      if (local_128 != (void *)0x0) {
        operator_delete(local_128,0x20);
      }
      if (bVar6 != false) {
        eVar11 = make_error_code(no_such_compilation);
        local_254 = eVar11._M_value;
        peVar9 = eVar11._M_cat;
        if ((_Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
             )local_120.pos_._M_t.
              super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
              .
              super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
              ._M_head_impl !=
            (_Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
             )0x0) {
          operator_delete((void *)local_120.pos_._M_t.
                                  super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
                                  ._M_head_impl,0x20);
        }
        goto LAB_0011f648;
      }
      db = local_228->db_;
      ppVar8 = index::
               hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
               ::iterator_base<true>::operator*(&local_120);
      repo::compilation::load((compilation *)local_210,db,&ppVar8->second);
      uVar1 = *(uint *)((long)&plVar7->definitions_[0].index + lVar10);
      uVar2 = *(uint *)&(((file_ptr *)(local_210._0_8_ + 0x10))->
                        super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr;
      if (uVar1 < uVar2) {
        ppVar8 = index::
                 hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                 ::iterator_base<true>::operator*(&local_120);
        *(value_type *)((long)&plVar7->definitions_[0].pointer.a_.a_ + lVar10) =
             (ppVar8->second).addr.a_.a_ +
             (ulong)*(uint *)((long)&plVar7->definitions_[0].index + lVar10) * 0x30 + 0x20;
      }
      else {
        eVar11 = make_error_code(index_out_of_range);
        local_238 = eVar11._M_cat;
        local_254 = eVar11._M_value;
      }
      if (local_210._8_8_ != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_);
      }
      if ((_Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
           )local_120.pos_._M_t.
            super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
            .
            super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
            ._M_head_impl !=
          (_Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
           )0x0) {
        operator_delete((void *)local_120.pos_._M_t.
                                super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                                .
                                super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
                                ._M_head_impl,0x20);
      }
      peVar9 = local_238;
      if (uVar2 <= uVar1) goto LAB_0011f648;
      lVar10 = lVar10 + 0x20;
    } while (uVar3 << 5 != lVar10);
  }
  local_254 = 0;
  peVar9 = (error_category *)std::_V2::system_category();
LAB_0011f648:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._8_8_);
  }
  if (local_240 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_240);
  }
  eVar11._4_4_ = 0;
  eVar11._M_value = local_254;
  eVar11._M_cat = peVar9;
  return eVar11;
}

Assistant:

std::error_code address_patch::operator() (transaction_base * const transaction) {
                auto const compilations = index::get_index<trailer::indices::compilation> (*db_);

                auto const fragment = repo::fragment::load (*transaction, fragment_extent_);
                for (repo::linked_definitions::value_type & l :
                     fragment->template at<repo::section_kind::linked_definitions> ()) {
                    auto const pos = compilations->find (*db_, l.compilation);
                    if (pos == compilations->end (*db_)) {
                        return error::no_such_compilation;
                    }
                    auto const compilation =
                        repo::compilation::load (transaction->db (), pos->second);
                    static_assert (std::is_unsigned<decltype (l.index)>::value,
                                   "index is not unsigned so we'll have to check for negative");
                    if (l.index >= compilation->size ()) {
                        return error::index_out_of_range;
                    }

                    l.pointer = repo::compilation::index_address (pos->second.addr, l.index);
                }
                return {};
            }